

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O0

int __thiscall miniros::RPCManager::bind(RPCManager *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  iterator this_00;
  XmlRpcServer *s;
  mapped_type *pmVar2;
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  FunctionInfo info;
  scoped_lock<std::mutex> lock;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
  *in_stack_ffffffffffffff08;
  FunctionInfo *in_stack_ffffffffffffff10;
  FunctionInfo *this_01;
  XMLRPCFunc *cb;
  key_type *in_stack_ffffffffffffff48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
  *in_stack_ffffffffffffff50;
  undefined1 local_60 [48];
  _Self local_30 [2];
  _Any_data local_20;
  RPCManager *local_10;
  undefined1 local_1;
  
  local_20._8_8_ = CONCAT44(in_register_00000034,__fd);
  local_20._M_unused._M_object = __addr;
  local_10 = this;
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_ffffffffffffff10,
             (mutex_type *)in_stack_ffffffffffffff08);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
            ::find(in_stack_ffffffffffffff08,(key_type *)0x496689);
  local_30[0]._M_node = this_00._M_node;
  local_60._24_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
       ::end(in_stack_ffffffffffffff08);
  bVar1 = std::operator!=(local_30,(_Self *)(local_60 + 0x18));
  if (bVar1) {
    local_1 = 0;
    local_60._20_4_ = 1;
  }
  else {
    cb = (XMLRPCFunc *)&stack0xffffffffffffff38;
    FunctionInfo::FunctionInfo(in_stack_ffffffffffffff10);
    std::__cxx11::string::operator=((string *)cb,(string *)local_20._8_8_);
    std::function<void_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&)>::operator=
              ((function<void_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&)> *)
               this_00._M_node,
               (function<void_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&)> *)this);
    this_01 = (FunctionInfo *)local_60;
    s = (XmlRpcServer *)operator_new(0x50);
    XMLRPCCallWrapper::XMLRPCCallWrapper((XMLRPCCallWrapper *)this_00._M_node,&this->uri_,cb,s);
    std::__shared_ptr<XmlRpc::XmlRpcServerMethod,_(__gnu_cxx::_Lock_policy)2>::
    reset<miniros::XMLRPCCallWrapper>
              ((__shared_ptr<XmlRpc::XmlRpcServerMethod,_(__gnu_cxx::_Lock_policy)2> *)cb,
               (XMLRPCCallWrapper *)s);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
             ::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    FunctionInfo::operator=(this_01,pmVar2);
    local_1 = 1;
    local_60._20_4_ = 1;
    FunctionInfo::~FunctionInfo(this_01);
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x49682d);
  return (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),local_1) & 0xffffff01;
}

Assistant:

bool RPCManager::bind(const std::string& function_name, const XMLRPCFunc& cb)
{
  std::scoped_lock<std::mutex> lock(functions_mutex_);
  if (functions_.find(function_name) != functions_.end())
  {
    return false;
  }

  FunctionInfo info;
  info.name = function_name;
  info.function = cb;
  info.wrapper.reset(new XMLRPCCallWrapper(function_name, cb, &server_));
  functions_[function_name] = info;

  return true;
}